

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
addStorage(Span<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  byte bVar3;
  undefined8 uVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  Entry *pEVar15;
  long lVar16;
  Entry *pEVar17;
  long lVar18;
  uchar *puVar19;
  undefined8 *puVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar48;
  undefined1 auVar46 [16];
  int iVar49;
  undefined1 auVar47 [16];
  int iVar50;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar74;
  undefined1 auVar73 [16];
  int iVar75;
  long lVar76;
  long lVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  long lVar85;
  long lVar86;
  
  bVar22 = 0;
  bVar3 = this->allocated;
  if (bVar3 == 0) {
    lVar14 = 0x30;
  }
  else if (bVar3 == 0x30) {
    lVar14 = 0x50;
  }
  else {
    lVar14 = (ulong)bVar3 + 0x10;
  }
  pEVar15 = (Entry *)operator_new__(lVar14 * 0x130);
  uVar23 = (ulong)this->allocated;
  if (uVar23 != 0) {
    lVar18 = 0;
    uVar21 = 0;
    do {
      pEVar17 = this->entries;
      puVar1 = (pEVar17->storage).data + lVar18;
      *(undefined4 *)((pEVar15->storage).data + lVar18) = *(undefined4 *)puVar1;
      memcpy((pEVar15->storage).data + lVar18 + 8,puVar1 + 8,0xb0);
      puVar1 = (pEVar15->storage).data + lVar18 + 0x128;
      puVar2 = (pEVar17->storage).data + lVar18 + 0xb8;
      puVar19 = puVar2;
      puVar20 = (undefined8 *)(puVar1 + -0x70);
      for (lVar16 = 0xb; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar20 = *(undefined8 *)puVar19;
        puVar19 = puVar19 + ((ulong)bVar22 * -2 + 1) * 8;
        puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
      }
      *(undefined4 *)(puVar1 + -0x18) = *(undefined4 *)(puVar2 + 0x58);
      uVar4 = *(undefined8 *)(puVar2 + 0x60);
      puVar2[0x60] = '\0';
      puVar2[0x61] = '\0';
      puVar2[0x62] = '\0';
      puVar2[99] = '\0';
      puVar2[100] = '\0';
      puVar2[0x65] = '\0';
      puVar2[0x66] = '\0';
      puVar2[0x67] = '\0';
      *(undefined8 *)(puVar1 + -0x10) = uVar4;
      uVar4 = *(undefined8 *)(puVar2 + 0x68);
      puVar2[0x68] = '\0';
      puVar2[0x69] = '\0';
      puVar2[0x6a] = '\0';
      puVar2[0x6b] = '\0';
      puVar2[0x6c] = '\0';
      puVar2[0x6d] = '\0';
      puVar2[0x6e] = '\0';
      puVar2[0x6f] = '\0';
      *(undefined8 *)(puVar1 + -8) = uVar4;
      uVar4 = *(undefined8 *)(puVar2 + 0x70);
      puVar2[0x70] = '\0';
      puVar2[0x71] = '\0';
      puVar2[0x72] = '\0';
      puVar2[0x73] = '\0';
      puVar2[0x74] = '\0';
      puVar2[0x75] = '\0';
      puVar2[0x76] = '\0';
      puVar2[0x77] = '\0';
      *(undefined8 *)puVar1 = uVar4;
      pEVar17 = this->entries;
      piVar5 = *(int **)((pEVar17->storage).data + lVar18 + 0x118);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    (*(QArrayData **)((pEVar17->storage).data + lVar18 + 0x118),0x10,0x10);
        }
      }
      uVar21 = uVar21 + 1;
      uVar23 = (ulong)this->allocated;
      lVar18 = lVar18 + 0x130;
    } while (uVar21 < uVar23);
  }
  if ((uint)uVar23 < (uint)lVar14) {
    lVar18 = lVar14 - uVar23;
    lVar16 = lVar18 + -1;
    lVar76 = uVar23 + 0xe;
    lVar84 = uVar23 + 0xf;
    lVar34 = uVar23 + 0xc;
    lVar35 = uVar23 + 0xd;
    lVar36 = uVar23 + 10;
    lVar37 = uVar23 + 0xb;
    lVar38 = uVar23 + 8;
    lVar39 = uVar23 + 9;
    lVar40 = uVar23 + 6;
    lVar41 = uVar23 + 7;
    lVar42 = uVar23 + 4;
    lVar43 = uVar23 + 5;
    lVar85 = uVar23 + 2;
    lVar86 = uVar23 + 3;
    lVar24 = uVar23 + 1;
    auVar25._8_4_ = (int)lVar16;
    auVar25._0_8_ = lVar16;
    auVar25._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pEVar17 = pEVar15 + uVar23;
    uVar21 = 0;
    do {
      auVar73._8_4_ = (int)uVar21;
      auVar73._0_8_ = uVar21;
      auVar73._12_4_ = (int)(uVar21 >> 0x20);
      auVar46 = auVar25 ^ _DAT_0013a880;
      auVar44 = (auVar73 | _DAT_0013a920) ^ _DAT_0013a880;
      iVar74 = auVar46._0_4_;
      iVar50 = -(uint)(iVar74 < auVar44._0_4_);
      iVar75 = auVar46._4_4_;
      iVar61 = -(uint)(iVar75 < auVar44._4_4_);
      iVar48 = auVar46._8_4_;
      iVar62 = -(uint)(iVar48 < auVar44._8_4_);
      iVar49 = auVar46._12_4_;
      iVar63 = -(uint)(iVar49 < auVar44._12_4_);
      auVar77._4_4_ = iVar50;
      auVar77._0_4_ = iVar50;
      auVar77._8_4_ = iVar62;
      auVar77._12_4_ = iVar62;
      auVar69 = pshuflw(in_XMM12,auVar77,0xe8);
      auVar51._4_4_ = -(uint)(auVar44._4_4_ == iVar75);
      auVar51._12_4_ = -(uint)(auVar44._12_4_ == iVar49);
      auVar51._0_4_ = auVar51._4_4_;
      auVar51._8_4_ = auVar51._12_4_;
      auVar64 = pshuflw(in_XMM10,auVar51,0xe8);
      auVar45._4_4_ = iVar61;
      auVar45._0_4_ = iVar61;
      auVar45._8_4_ = iVar63;
      auVar45._12_4_ = iVar63;
      auVar46 = pshuflw(_DAT_0013a880,auVar45,0xe8);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar46 | auVar64 & auVar69) ^ auVar44;
      auVar44 = packssdw(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (pEVar17->storage).data[0] = (char)uVar23 + '\x01';
      }
      auVar45 = auVar51 & auVar77 | auVar45;
      auVar44 = packssdw(auVar45,auVar45);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar46,auVar44 ^ auVar46);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._0_4_ >> 8 & 1) != 0) {
        pEVar17[1].storage.data[0] = (char)lVar24 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a910) ^ _DAT_0013a880;
      iVar50 = -(uint)(iVar74 < auVar44._0_4_);
      iVar62 = -(uint)(iVar75 < auVar44._4_4_);
      iVar61 = -(uint)(iVar48 < auVar44._8_4_);
      iVar63 = -(uint)(iVar49 < auVar44._12_4_);
      auVar69._4_4_ = iVar50;
      auVar69._0_4_ = iVar50;
      auVar69._8_4_ = iVar61;
      auVar69._12_4_ = iVar61;
      iVar50 = -(uint)(auVar44._4_4_ == iVar75);
      iVar61 = -(uint)(auVar44._12_4_ == iVar49);
      auVar78._4_4_ = iVar50;
      auVar78._0_4_ = iVar50;
      auVar78._8_4_ = iVar61;
      auVar78._12_4_ = iVar61;
      auVar70._4_4_ = iVar62;
      auVar70._0_4_ = iVar62;
      auVar70._8_4_ = iVar63;
      auVar70._12_4_ = iVar63;
      auVar44 = auVar78 & auVar69 | auVar70;
      auVar44 = packssdw(auVar44,auVar44);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar64,auVar44 ^ auVar64);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
        pEVar17[2].storage.data[0] = (char)lVar85 + '\x01';
      }
      auVar44 = pshufhw(auVar44,auVar69,0x84);
      auVar51 = pshufhw(auVar69,auVar78,0x84);
      auVar46 = pshufhw(auVar44,auVar70,0x84);
      auVar26._8_4_ = 0xffffffff;
      auVar26._0_8_ = 0xffffffffffffffff;
      auVar26._12_4_ = 0xffffffff;
      auVar26 = (auVar46 | auVar51 & auVar44) ^ auVar26;
      auVar44 = packssdw(auVar26,auVar26);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._0_4_ >> 0x18 & 1) != 0) {
        pEVar17[3].storage.data[0] = (char)lVar86 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a900) ^ _DAT_0013a880;
      auVar65._0_4_ = -(uint)(iVar74 < auVar44._0_4_);
      auVar65._4_4_ = -(uint)(iVar75 < auVar44._4_4_);
      auVar65._8_4_ = -(uint)(iVar48 < auVar44._8_4_);
      auVar65._12_4_ = -(uint)(iVar49 < auVar44._12_4_);
      auVar79._4_4_ = auVar65._0_4_;
      auVar79._0_4_ = auVar65._0_4_;
      auVar79._8_4_ = auVar65._8_4_;
      auVar79._12_4_ = auVar65._8_4_;
      auVar51 = pshuflw(auVar70,auVar79,0xe8);
      auVar27._0_4_ = -(uint)(auVar44._0_4_ == iVar74);
      auVar27._4_4_ = -(uint)(auVar44._4_4_ == iVar75);
      auVar27._8_4_ = -(uint)(auVar44._8_4_ == iVar48);
      auVar27._12_4_ = -(uint)(auVar44._12_4_ == iVar49);
      auVar52._4_4_ = auVar27._4_4_;
      auVar52._0_4_ = auVar27._4_4_;
      auVar52._8_4_ = auVar27._12_4_;
      auVar52._12_4_ = auVar27._12_4_;
      auVar44 = pshuflw(auVar27,auVar52,0xe8);
      auVar53._4_4_ = auVar65._4_4_;
      auVar53._0_4_ = auVar65._4_4_;
      auVar53._8_4_ = auVar65._12_4_;
      auVar53._12_4_ = auVar65._12_4_;
      auVar46 = pshuflw(auVar65,auVar53,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 & auVar51,(auVar46 | auVar44 & auVar51) ^ auVar6);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar17[4].storage.data[0] = (char)lVar42 + '\x01';
      }
      auVar53 = auVar52 & auVar79 | auVar53;
      auVar46 = packssdw(auVar53,auVar53);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44,auVar46 ^ auVar7);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._4_2_ >> 8 & 1) != 0) {
        pEVar17[5].storage.data[0] = (char)lVar43 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a8f0) ^ _DAT_0013a880;
      iVar50 = -(uint)(iVar74 < auVar44._0_4_);
      iVar62 = -(uint)(iVar75 < auVar44._4_4_);
      iVar61 = -(uint)(iVar48 < auVar44._8_4_);
      iVar63 = -(uint)(iVar49 < auVar44._12_4_);
      auVar54._4_4_ = iVar50;
      auVar54._0_4_ = iVar50;
      auVar54._8_4_ = iVar61;
      auVar54._12_4_ = iVar61;
      iVar50 = -(uint)(auVar44._4_4_ == iVar75);
      iVar61 = -(uint)(auVar44._12_4_ == iVar49);
      auVar71._4_4_ = iVar50;
      auVar71._0_4_ = iVar50;
      auVar71._8_4_ = iVar61;
      auVar71._12_4_ = iVar61;
      auVar80._4_4_ = iVar62;
      auVar80._0_4_ = iVar62;
      auVar80._8_4_ = iVar63;
      auVar80._12_4_ = iVar63;
      auVar44 = auVar71 & auVar54 | auVar80;
      auVar44 = packssdw(auVar44,auVar44);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar8,auVar44 ^ auVar8);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar17[6].storage.data[0] = (char)lVar40 + '\x01';
      }
      auVar44 = pshufhw(auVar44,auVar54,0x84);
      auVar51 = pshufhw(auVar54,auVar71,0x84);
      auVar46 = pshufhw(auVar44,auVar80,0x84);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar28 = (auVar46 | auVar51 & auVar44) ^ auVar28;
      auVar44 = packssdw(auVar28,auVar28);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._6_2_ >> 8 & 1) != 0) {
        pEVar17[7].storage.data[0] = (char)lVar41 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a8e0) ^ _DAT_0013a880;
      auVar66._0_4_ = -(uint)(iVar74 < auVar44._0_4_);
      auVar66._4_4_ = -(uint)(iVar75 < auVar44._4_4_);
      auVar66._8_4_ = -(uint)(iVar48 < auVar44._8_4_);
      auVar66._12_4_ = -(uint)(iVar49 < auVar44._12_4_);
      auVar81._4_4_ = auVar66._0_4_;
      auVar81._0_4_ = auVar66._0_4_;
      auVar81._8_4_ = auVar66._8_4_;
      auVar81._12_4_ = auVar66._8_4_;
      auVar51 = pshuflw(auVar71,auVar81,0xe8);
      auVar29._0_4_ = -(uint)(auVar44._0_4_ == iVar74);
      auVar29._4_4_ = -(uint)(auVar44._4_4_ == iVar75);
      auVar29._8_4_ = -(uint)(auVar44._8_4_ == iVar48);
      auVar29._12_4_ = -(uint)(auVar44._12_4_ == iVar49);
      auVar55._4_4_ = auVar29._4_4_;
      auVar55._0_4_ = auVar29._4_4_;
      auVar55._8_4_ = auVar29._12_4_;
      auVar55._12_4_ = auVar29._12_4_;
      auVar44 = pshuflw(auVar29,auVar55,0xe8);
      auVar56._4_4_ = auVar66._4_4_;
      auVar56._0_4_ = auVar66._4_4_;
      auVar56._8_4_ = auVar66._12_4_;
      auVar56._12_4_ = auVar66._12_4_;
      auVar46 = pshuflw(auVar66,auVar56,0xe8);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar67 = (auVar46 | auVar44 & auVar51) ^ auVar67;
      auVar46 = packssdw(auVar67,auVar67);
      auVar44 = packsswb(auVar44 & auVar51,auVar46);
      if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar17[8].storage.data[0] = (char)lVar38 + '\x01';
      }
      auVar56 = auVar55 & auVar81 | auVar56;
      auVar46 = packssdw(auVar56,auVar56);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar46 = packssdw(auVar46 ^ auVar9,auVar46 ^ auVar9);
      auVar44 = packsswb(auVar44,auVar46);
      if ((auVar44._8_2_ >> 8 & 1) != 0) {
        pEVar17[9].storage.data[0] = (char)lVar39 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a8d0) ^ _DAT_0013a880;
      iVar50 = -(uint)(iVar74 < auVar44._0_4_);
      iVar62 = -(uint)(iVar75 < auVar44._4_4_);
      iVar61 = -(uint)(iVar48 < auVar44._8_4_);
      iVar63 = -(uint)(iVar49 < auVar44._12_4_);
      auVar57._4_4_ = iVar50;
      auVar57._0_4_ = iVar50;
      auVar57._8_4_ = iVar61;
      auVar57._12_4_ = iVar61;
      iVar50 = -(uint)(auVar44._4_4_ == iVar75);
      iVar61 = -(uint)(auVar44._12_4_ == iVar49);
      auVar72._4_4_ = iVar50;
      auVar72._0_4_ = iVar50;
      auVar72._8_4_ = iVar61;
      auVar72._12_4_ = iVar61;
      auVar82._4_4_ = iVar62;
      auVar82._0_4_ = iVar62;
      auVar82._8_4_ = iVar63;
      auVar82._12_4_ = iVar63;
      auVar44 = auVar72 & auVar57 | auVar82;
      auVar44 = packssdw(auVar44,auVar44);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar10,auVar44 ^ auVar10);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pEVar17[10].storage.data[0] = (char)lVar36 + '\x01';
      }
      auVar44 = pshufhw(auVar44,auVar57,0x84);
      auVar51 = pshufhw(auVar57,auVar72,0x84);
      auVar46 = pshufhw(auVar44,auVar82,0x84);
      auVar30._8_4_ = 0xffffffff;
      auVar30._0_8_ = 0xffffffffffffffff;
      auVar30._12_4_ = 0xffffffff;
      auVar30 = (auVar46 | auVar51 & auVar44) ^ auVar30;
      auVar44 = packssdw(auVar30,auVar30);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._10_2_ >> 8 & 1) != 0) {
        pEVar17[0xb].storage.data[0] = (char)lVar37 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a8c0) ^ _DAT_0013a880;
      auVar68._0_4_ = -(uint)(iVar74 < auVar44._0_4_);
      auVar68._4_4_ = -(uint)(iVar75 < auVar44._4_4_);
      auVar68._8_4_ = -(uint)(iVar48 < auVar44._8_4_);
      auVar68._12_4_ = -(uint)(iVar49 < auVar44._12_4_);
      auVar83._4_4_ = auVar68._0_4_;
      auVar83._0_4_ = auVar68._0_4_;
      auVar83._8_4_ = auVar68._8_4_;
      auVar83._12_4_ = auVar68._8_4_;
      auVar51 = pshuflw(auVar72,auVar83,0xe8);
      auVar31._0_4_ = -(uint)(auVar44._0_4_ == iVar74);
      auVar31._4_4_ = -(uint)(auVar44._4_4_ == iVar75);
      auVar31._8_4_ = -(uint)(auVar44._8_4_ == iVar48);
      auVar31._12_4_ = -(uint)(auVar44._12_4_ == iVar49);
      auVar58._4_4_ = auVar31._4_4_;
      auVar58._0_4_ = auVar31._4_4_;
      auVar58._8_4_ = auVar31._12_4_;
      auVar58._12_4_ = auVar31._12_4_;
      auVar44 = pshuflw(auVar31,auVar58,0xe8);
      auVar59._4_4_ = auVar68._4_4_;
      auVar59._0_4_ = auVar68._4_4_;
      auVar59._8_4_ = auVar68._12_4_;
      auVar59._12_4_ = auVar68._12_4_;
      auVar46 = pshuflw(auVar68,auVar59,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 & auVar51,(auVar46 | auVar44 & auVar51) ^ auVar11);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pEVar17[0xc].storage.data[0] = (char)lVar34 + '\x01';
      }
      auVar59 = auVar58 & auVar83 | auVar59;
      auVar46 = packssdw(auVar59,auVar59);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44,auVar46 ^ auVar12);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._12_2_ >> 8 & 1) != 0) {
        pEVar17[0xd].storage.data[0] = (char)lVar35 + '\x01';
      }
      auVar44 = (auVar73 | _DAT_0013a8b0) ^ _DAT_0013a880;
      auVar32._0_4_ = -(uint)(iVar74 < auVar44._0_4_);
      auVar32._4_4_ = -(uint)(iVar75 < auVar44._4_4_);
      auVar32._8_4_ = -(uint)(iVar48 < auVar44._8_4_);
      auVar32._12_4_ = -(uint)(iVar49 < auVar44._12_4_);
      auVar60._4_4_ = auVar32._0_4_;
      auVar60._0_4_ = auVar32._0_4_;
      auVar60._8_4_ = auVar32._8_4_;
      auVar60._12_4_ = auVar32._8_4_;
      iVar74 = -(uint)(auVar44._4_4_ == iVar75);
      iVar75 = -(uint)(auVar44._12_4_ == iVar49);
      auVar47._4_4_ = iVar74;
      auVar47._0_4_ = iVar74;
      auVar47._8_4_ = iVar75;
      auVar47._12_4_ = iVar75;
      in_XMM12._4_4_ = auVar32._4_4_;
      in_XMM12._0_4_ = auVar32._4_4_;
      in_XMM12._8_4_ = auVar32._12_4_;
      in_XMM12._12_4_ = auVar32._12_4_;
      in_XMM10 = auVar47 & auVar60 | in_XMM12;
      auVar44 = packssdw(auVar32,in_XMM10);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar13,auVar44 ^ auVar13);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pEVar17[0xe].storage.data[0] = (char)lVar76 + '\x01';
      }
      auVar44 = pshufhw(auVar44,auVar60,0x84);
      auVar51 = pshufhw(auVar47,auVar47,0x84);
      auVar46 = pshufhw(auVar44,in_XMM12,0x84);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = (auVar46 | auVar51 & auVar44) ^ auVar33;
      auVar44 = packssdw(auVar33,auVar33);
      auVar44 = packsswb(auVar44,auVar44);
      if ((auVar44._14_2_ >> 8 & 1) != 0) {
        pEVar17[0xf].storage.data[0] = (char)lVar84 + '\x01';
      }
      uVar21 = uVar21 + 0x10;
      uVar23 = uVar23 + 0x10;
      lVar24 = lVar24 + 0x10;
      lVar85 = lVar85 + 0x10;
      lVar86 = lVar86 + 0x10;
      lVar42 = lVar42 + 0x10;
      lVar43 = lVar43 + 0x10;
      lVar40 = lVar40 + 0x10;
      lVar41 = lVar41 + 0x10;
      lVar38 = lVar38 + 0x10;
      lVar39 = lVar39 + 0x10;
      lVar36 = lVar36 + 0x10;
      lVar37 = lVar37 + 0x10;
      lVar34 = lVar34 + 0x10;
      lVar35 = lVar35 + 0x10;
      lVar76 = lVar76 + 0x10;
      lVar84 = lVar84 + 0x10;
      pEVar17 = pEVar17 + 0x10;
    } while ((lVar18 + 0xfU & 0xfffffffffffffff0) != uVar21);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar15;
  this->allocated = (uchar)lVar14;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }